

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O3

_Bool build_circular(chunk *c,loc_conflict centre,wchar_t rating)

{
  uint uVar1;
  _Bool _Var2;
  _Bool _Var3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  void *p;
  ulong uVar11;
  loc_conflict lVar12;
  int iVar13;
  uint uVar14;
  wchar_t wVar15;
  wchar_t wVar16;
  long lVar17;
  uint uVar18;
  wchar_t wVar19;
  int iVar20;
  undefined8 in_R9;
  int iVar21;
  wchar_t wVar22;
  loc grid;
  loc lVar23;
  ulong uVar24;
  uint uVar25;
  long lVar26;
  bool bVar27;
  wchar_t local_f0;
  ulong local_e8;
  loc_conflict centre_local;
  ulong local_c0;
  loc_conflict offset;
  
  centre_local = centre;
  uVar4 = Rand_div(2);
  uVar5 = Rand_div(3);
  iVar21 = uVar5 + uVar4;
  wVar15 = c->depth;
  uVar6 = Rand_div(0x19);
  wVar22 = iVar21 * 2 + L'\x12';
  event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE,wVar22,wVar22);
  local_f0 = centre.y;
  if ((c->height <= local_f0) || (c->width <= centre.x)) {
    _Var2 = find_space(&centre_local,wVar22,wVar22);
    if (!_Var2) {
      return false;
    }
    centre = (loc_conflict)((ulong)centre_local & 0xffffffff);
    local_f0 = centre_local.y;
  }
  iVar7 = uVar5 + uVar4 + 4;
  iVar20 = iVar21 + 5;
  iVar8 = centre.x;
  if (-1 < iVar20) {
    wVar22 = uVar6 + L'\x01';
    uVar14 = 0;
    iVar13 = iVar20;
    iVar10 = 0;
    do {
      wVar19 = (wchar_t)(wVar15 <= wVar22);
      fill_xrange(c,local_f0 - iVar10,iVar8 - iVar13,iVar8 + iVar13,wVar19,(wchar_t)in_R9,
                  SUB41(wVar22,0));
      fill_xrange(c,iVar10 + local_f0,iVar8 - iVar13,iVar8 + iVar13,wVar19,(wchar_t)in_R9,
                  SUB41(wVar22,0));
      fill_yrange(c,iVar8 - iVar10,local_f0 - iVar13,local_f0 + iVar13,wVar19,(wchar_t)in_R9,
                  SUB41(wVar22,0));
      fill_yrange(c,iVar10 + iVar8,local_f0 - iVar13,local_f0 + iVar13,wVar19,(wchar_t)in_R9,
                  SUB41(wVar22,0));
      if (iVar10 < iVar20) {
        iVar9 = iVar13 * 2 + -1;
        iVar13 = iVar13 + 1;
        uVar18 = uVar14 + ~(iVar10 * 2);
        do {
          uVar14 = uVar18;
          uVar18 = iVar9 + uVar14;
          uVar25 = -uVar18;
          if (0 < (int)uVar18) {
            uVar25 = uVar18;
          }
          uVar1 = -uVar14;
          if (0 < (int)uVar14) {
            uVar1 = uVar14;
          }
          iVar13 = iVar13 + -1;
          iVar9 = iVar9 + -2;
        } while (uVar25 < uVar1);
      }
      bVar27 = iVar10 != iVar20;
      iVar10 = iVar10 + 1;
    } while (bVar27);
  }
  iVar20 = local_f0 - iVar7;
  uVar14 = iVar20 - 2;
  uVar18 = iVar21 + local_f0 + 6;
  if ((int)uVar14 <= (int)uVar18) {
    uVar25 = (iVar8 - iVar7) - 2;
    iVar7 = iVar21 + iVar8 + 6;
    if ((int)uVar25 <= iVar7) {
      iVar13 = (iVar7 - uVar25) + 1;
      p = mem_zalloc((long)(int)(((uVar18 - iVar20) + 3) * iVar13));
      local_e8 = (ulong)uVar14;
      if ((int)uVar14 < 1) {
        local_e8 = 0;
      }
      uVar14 = c->height + L'\xffffffff';
      if ((int)uVar18 <= (int)uVar14) {
        uVar14 = uVar18;
      }
      uVar18 = 0;
      if (0 < (int)uVar25) {
        uVar18 = uVar25;
      }
      if ((int)local_e8 <= (int)uVar14) {
        iVar20 = c->width + L'\xffffffff';
        if (iVar7 <= iVar20) {
          iVar20 = iVar7;
        }
        local_c0 = local_e8;
        do {
          iVar10 = (int)local_c0;
          iVar7 = 1;
          if (1 < iVar10) {
            iVar7 = iVar10;
          }
          if ((int)uVar18 <= iVar20) {
            wVar19 = iVar7 + L'\xffffffff';
            wVar15 = c->height + L'\xffffffff';
            wVar22 = (wchar_t)(local_c0 + 1);
            if (wVar22 <= wVar15) {
              wVar15 = wVar22;
            }
            uVar24 = (ulong)uVar18;
            do {
              iVar9 = (int)uVar24;
              iVar7 = 1;
              if (1 < iVar9) {
                iVar7 = iVar9;
              }
              lVar23 = (loc)(uVar24 + (local_c0 << 0x20));
              _Var2 = square_isfloor((chunk_conflict *)c,lVar23);
              if (_Var2) {
                wVar22 = c->width + L'\xffffffff';
                if (iVar9 + L'\x01' <= wVar22) {
                  wVar22 = iVar9 + L'\x01';
                }
                _Var2 = square_isroom((chunk_conflict *)c,lVar23);
                if (!_Var2) {
                  __assert_fail("square_isroom(c, grid)",
                                "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/gen-room.c"
                                ,0x1d5,
                                "void set_bordering_walls(struct chunk *, int, int, int, int)");
                }
                if (wVar15 - wVar19 == 2) {
                  wVar16 = iVar7 + L'\xffffffff';
                  if ((wVar22 - wVar16 == 2) && (wVar19 <= wVar15)) {
                    lVar26 = (long)wVar22;
                    lVar23.y = wVar19;
                    lVar23.x = wVar16;
                    iVar7 = 0;
                    uVar11 = (ulong)(uint)wVar19;
                    do {
                      lVar17 = (ulong)(uint)wVar16 - 1;
                      grid = lVar23;
                      if (wVar16 <= wVar22) {
                        do {
                          _Var2 = square_isfloor((chunk_conflict *)c,grid);
                          _Var3 = square_isroom((chunk_conflict *)c,grid);
                          if (_Var2 != _Var3) {
                            __assert_fail("floor == square_isroom( c, adj)",
                                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/gen-room.c"
                                          ,0x1ee,
                                          "void set_bordering_walls(struct chunk *, int, int, int, int)"
                                         );
                          }
                          iVar7 = iVar7 + (uint)_Var2;
                          lVar17 = lVar17 + 1;
                          grid = (loc)((long)grid + 1);
                        } while (lVar17 < lVar26);
                      }
                      lVar23 = (loc)((long)lVar23 + 0x100000000);
                      bVar27 = (long)uVar11 < (long)wVar15;
                      uVar11 = uVar11 + 1;
                    } while (bVar27);
                    if (iVar7 == 9) goto LAB_001512d9;
                  }
                }
                *(undefined1 *)
                 ((long)p + (long)(int)(((iVar10 - (int)local_e8) * iVar13 - uVar18) + iVar9)) = 1;
              }
              else {
                _Var2 = square_isroom((chunk_conflict *)c,lVar23);
                if (_Var2) {
                  __assert_fail("!square_isroom(c, grid)",
                                "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/gen-room.c"
                                ,0x1ff,
                                "void set_bordering_walls(struct chunk *, int, int, int, int)");
                }
              }
LAB_001512d9:
              uVar24 = uVar24 + 1;
            } while (uVar24 != iVar20 + 1);
          }
          bVar27 = local_c0 < uVar14;
          local_c0 = local_c0 + 1;
        } while (bVar27);
        lVar26 = local_e8 << 0x20;
        iVar7 = 0;
        do {
          uVar24 = (ulong)uVar18;
          iVar10 = iVar7;
          if ((int)uVar18 <= iVar20) {
            do {
              if (*(char *)((long)p + (long)iVar10) == '\x01') {
                lVar23 = (loc)(lVar26 + uVar24);
                _Var2 = square_isfloor((chunk_conflict *)c,lVar23);
                if ((!_Var2) || (_Var2 = square_isroom((chunk_conflict *)c,lVar23), !_Var2)) {
                  __assert_fail("square_isfloor(c, grid) && square_isroom(c, grid)",
                                "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/gen-room.c"
                                ,0x209,
                                "void set_bordering_walls(struct chunk *, int, int, int, int)");
                }
                square_set_feat((chunk_conflict *)c,lVar23,L'\x15');
                generate_mark(c,(wchar_t)local_e8,(wchar_t)uVar24,(wchar_t)local_e8,(wchar_t)uVar24,
                              L'\f');
              }
              uVar24 = uVar24 + 1;
              iVar10 = iVar10 + 1;
            } while (iVar20 + 1 != uVar24);
          }
          lVar26 = lVar26 + 0x100000000;
          iVar7 = iVar7 + iVar13;
          bVar27 = local_e8 < uVar14;
          local_e8 = local_e8 + 1;
        } while (bVar27);
      }
      mem_free(p);
      if ((0 < iVar21) && (uVar4 = Rand_div(4), (int)uVar4 < iVar21)) {
        event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,"middle chamber");
        rand_dir(&offset);
        draw_rectangle(c,local_f0 + L'\xfffffffe',iVar8 + L'\xfffffffe',local_f0 + L'\x02',
                       iVar8 + L'\x02',L'\x15',L'\v',false);
        lVar12 = loc(iVar8 + offset.x * 2,local_f0 + offset.y * 2);
        place_closed_door((chunk_conflict *)c,lVar12);
        wVar15 = c->depth;
        wVar22 = Rand_div(2);
        lVar12 = centre_local;
        vault_objects((chunk_conflict *)c,centre_local,wVar15,wVar22);
        wVar15 = c->depth;
        wVar22 = Rand_div(3);
        vault_monsters((chunk_conflict *)c,lVar12,wVar15 + L'\x01',wVar22);
      }
      return true;
    }
  }
  __assert_fail("x2 >= x1 && y2 >= y1",
                "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/gen-room.c"
                ,0x1c2,"void set_bordering_walls(struct chunk *, int, int, int, int)");
}

Assistant:

bool build_circular(struct chunk *c, struct loc centre, int rating)
{
	/* Pick a room size */
	int radius = 2 + randint1(2) + randint1(3);

	/* Occasional light */
	bool light = c->depth <= randint1(25) ? true : false;

	/* Find and reserve lots of space in the dungeon.  Get center of room. */
	event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE,
		2 * radius + 10, 2 * radius + 10);
	if ((centre.y >= c->height) || (centre.x >= c->width)) {
		if (!find_space(&centre, 2 * radius + 10, 2 * radius + 10))
			return (false);
	}

	/* Mark as a room. */
	fill_circle(c, centre.y, centre.x, radius + 1, 0, FEAT_FLOOR,
		SQUARE_NONE, light);

	/* Convert some floors to be the outer walls. */
	set_bordering_walls(c, centre.y - radius - 2, centre.x - radius - 2,
		centre.y + radius + 2, centre.x + radius + 2);

	/* Especially large circular rooms will have a middle chamber */
	if (radius - 4 > 0 && randint0(4) < radius - 4) {
		struct loc offset;

		event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,
			"middle chamber");

		/* choose a random direction */
		rand_dir(&offset);

		/* draw a room with a closed door on a random side */
		draw_rectangle(c, centre.y - 2, centre.x - 2, centre.y + 2,
			centre.x + 2, FEAT_GRANITE, SQUARE_WALL_INNER, false);
		place_closed_door(c, loc(centre.x + offset.x * 2,
								 centre.y + offset.y * 2));

		/* Place a treasure in the vault */
		vault_objects(c, centre, c->depth, randint0(2));

		/* create some monsterss */
		vault_monsters(c, centre, c->depth + 1, randint0(3));
	}

	return true;
}